

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content-parser.c
# Opt level: O3

void htmlentities_append(bc_string_t *str,char c)

{
  int iVar1;
  undefined7 in_register_00000031;
  
  iVar1 = (int)CONCAT71(in_register_00000031,c);
  if (iVar1 < 0x2f) {
    if (iVar1 == 0x22) {
      bc_string_append(str,"&quot;");
      return;
    }
    if (iVar1 == 0x26) {
      bc_string_append(str,"&amp;");
      return;
    }
    if (iVar1 == 0x27) {
      bc_string_append(str,"&#x27;");
      return;
    }
  }
  else {
    if (iVar1 == 0x2f) {
      bc_string_append(str,"&#x2F;");
      return;
    }
    if (iVar1 == 0x3e) {
      bc_string_append(str,"&gt;");
      return;
    }
    if (iVar1 == 0x3c) {
      bc_string_append(str,"&lt;");
      return;
    }
  }
  bc_string_append_c(str,c);
  return;
}

Assistant:

static void
htmlentities_append(bc_string_t *str, char c)
{
    const char *e = htmlentities(c);
    if (e == NULL)
        bc_string_append_c(str, c);
    else
        bc_string_append(str, e);
}